

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesDOMParser.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XercesDOMParser::setXMLEntityResolver(XercesDOMParser *this,XMLEntityResolver *handler)

{
  XMLEntityHandler *pXVar1;
  XMLScanner *pXVar2;
  EntityResolver **ppEVar3;
  
  this->fXMLEntityResolver = handler;
  pXVar2 = (this->super_AbstractDOMParser).fScanner;
  if (handler == (XMLEntityResolver *)0x0) {
    pXVar2->fEntityHandler = (XMLEntityHandler *)0x0;
    ppEVar3 = (EntityResolver **)&(pXVar2->fReaderMgr).fEntityHandler;
  }
  else {
    pXVar1 = &(this->super_AbstractDOMParser).super_XMLEntityHandler;
    pXVar2->fEntityHandler = pXVar1;
    (pXVar2->fReaderMgr).fEntityHandler = pXVar1;
    ppEVar3 = &this->fEntityResolver;
  }
  *ppEVar3 = (EntityResolver *)0x0;
  return;
}

Assistant:

void XercesDOMParser::setXMLEntityResolver(XMLEntityResolver* const handler)
{
    fXMLEntityResolver = handler;
    if (fXMLEntityResolver) {
        getScanner()->setEntityHandler(this);
        fEntityResolver = 0;
    }
    else {
        getScanner()->setEntityHandler(0);
    }
}